

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall Reducer::reduceUsingPasses(Reducer *this)

{
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer *__return_storage_ptr___00;
  undefined4 uVar1;
  pointer pbVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined1 auVar8 [8];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  string local_5d8 [32];
  string local_5b8 [32];
  string local_598 [32];
  string local_578 [32];
  string local_558 [32];
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  string local_4d8 [32];
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238;
  string local_218;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pass;
  undefined1 local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  undefined1 local_90 [8];
  string currCommand;
  ulong local_68;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator_type local_35;
  uint local_34;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_678,"-Oz",(allocator<char> *)local_118);
  std::__cxx11::string::string<std::allocator<char>>(local_658,"-Os",(allocator<char> *)local_90);
  std::__cxx11::string::string<std::allocator<char>>
            (local_638,"-O1",
             (allocator<char> *)
             &passes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string<std::allocator<char>>
            (local_618,"-O2",(allocator<char> *)(pass.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>(local_5f8,"-O3",(allocator<char> *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>(local_5d8,"-O4",(allocator<char> *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b8,"--flatten -Os",(allocator<char> *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>(local_598,"--flatten -O3",&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            (local_578,"--flatten --simplify-locals-notee-nostructure --local-cse -Os",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_558,"--coalesce-locals --vacuum",&local_4e);
  std::__cxx11::string::string<std::allocator<char>>(local_538,"--dae",&local_4d);
  std::__cxx11::string::string<std::allocator<char>>(local_518,"--dae-optimizing",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>(local_4f8,"--dce",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d8,"--duplicate-function-elimination",&local_4a);
  std::__cxx11::string::string<std::allocator<char>>(local_4b8,"--gto",&local_49);
  std::__cxx11::string::string<std::allocator<char>>(local_498,"--inlining",&local_48);
  std::__cxx11::string::string<std::allocator<char>>(local_478,"--inlining-optimizing",&local_47);
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,"--optimize-level=3 --inlining-optimizing",&local_46);
  std::__cxx11::string::string<std::allocator<char>>(local_438,"--local-cse",&local_45);
  std::__cxx11::string::string<std::allocator<char>>(local_418,"--memory-packing",&local_44);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f8,"--remove-unused-names --merge-blocks --vacuum",&local_43);
  std::__cxx11::string::string<std::allocator<char>>(local_3d8,"--optimize-instructions",&local_42);
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"--precompute",&local_41);
  std::__cxx11::string::string<std::allocator<char>>(local_398,"--remove-imports",&local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_378,"--remove-memory",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"--remove-unused-names --remove-unused-brs",&local_3e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_338,"--remove-unused-module-elements",&local_3d);
  std::__cxx11::string::string<std::allocator<char>>
            (local_318,"--remove-unused-nonfunction-module-elements",&local_3c);
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"--reorder-functions",&local_3b);
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"--reorder-locals",&local_3a);
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"--simplify-globals",&local_39);
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"--simplify-locals --vacuum",&local_38);
  std::__cxx11::string::string<std::allocator<char>>(local_278,"--strip",&local_37);
  std::__cxx11::string::string<std::allocator<char>>(local_258,"--vacuum",&local_36);
  __l._M_len = 0x22;
  __l._M_array = (iterator)local_678;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8,__l,&local_35);
  lVar7 = 0x420;
  do {
    std::__cxx11::string::~string((string *)(local_678 + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
  currCommand.field_2._8_8_ = &this->working;
  std::__cxx11::string::string(local_198,(string *)currCommand.field_2._8_8_);
  local_68 = wasm::file_size(local_198);
  std::__cxx11::string::~string(local_198);
  __rhs = &this->test;
  local_34 = (uint)CONCAT71((int7)((ulong)&this->command >> 8),1);
  while (pbVar2 = passes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, (local_34 & 1) != 0) {
    local_34 = 0;
    for (auVar8 = local_d8; auVar8 != (undefined1  [8])pbVar2;
        auVar8 = (undefined1  [8])((long)auVar8 + 0x20)) {
      std::__cxx11::string::string((string *)local_118,(string *)auVar8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &passes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"wasm-opt",
                 (allocator<char> *)(pass.field_2._M_local_buf + 8));
      wasm::Path::getBinaryenBinaryTool((string *)local_678);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678,
                     " ");
      std::__cxx11::string::~string((string *)local_678);
      std::__cxx11::string::~string
                ((string *)
                 &passes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator+(&local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     currCommand.field_2._8_8_," -o ");
      std::operator+(&local_158,&local_138,__rhs);
      std::operator+(&local_178,&local_158," ");
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&pass.field_2 + 8);
      std::operator+(__return_storage_ptr__,&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118)
      ;
      __return_storage_ptr___00 =
           &passes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr___00,__return_storage_ptr__," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_678,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr___00,&extraFlags_abi_cxx11_);
      std::__cxx11::string::append((string *)local_90);
      std::__cxx11::string::~string((string *)local_678);
      std::__cxx11::string::~string
                ((string *)
                 &passes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(pass.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_138);
      if (this->binary == false) {
        std::__cxx11::string::append(local_90);
      }
      if (this->verbose == true) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"|    trying pass command: ");
        poVar4 = std::operator<<(poVar4,(string *)local_90);
        std::operator<<(poVar4,"\n");
      }
      std::__cxx11::string::string((string *)&local_238,(string *)local_90);
      ProgramResult::ProgramResult((ProgramResult *)local_678,&local_238);
      uVar1 = local_678._0_4_;
      std::__cxx11::string::~string((string *)(local_678 + 8));
      std::__cxx11::string::~string((string *)&local_238);
      if (uVar1 == 0) {
        std::__cxx11::string::string(local_1d8,(string *)__rhs);
        uVar5 = wasm::file_size(local_1d8);
        std::__cxx11::string::~string(local_1d8);
        if (uVar5 < local_68) {
          std::__cxx11::string::string((string *)&local_218,(string *)&this->command);
          ProgramResult::ProgramResult((ProgramResult *)local_678,&local_218);
          bVar3 = ProgramResult::operator==((ProgramResult *)local_678,&expected);
          std::__cxx11::string::~string((string *)(local_678 + 8));
          std::__cxx11::string::~string((string *)&local_218);
          if (bVar3) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"|    command \"");
            poVar4 = std::operator<<(poVar4,(string *)local_90);
            poVar4 = std::operator<<(poVar4,"\" succeeded, reduced size to ");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::operator<<(poVar4,'\n');
            std::__cxx11::string::string(local_1b8,(string *)__rhs);
            std::__cxx11::string::string(local_1f8,(string *)currCommand.field_2._8_8_);
            wasm::copy_file(local_1b8,local_1f8);
            std::__cxx11::string::~string(local_1f8);
            uVar6 = std::__cxx11::string::~string(local_1b8);
            local_34 = (uint)CONCAT71((int7)((ulong)uVar6 >> 8),1);
            local_68 = uVar5;
          }
        }
      }
      std::__cxx11::string::~string((string *)local_90);
      std::__cxx11::string::~string((string *)local_118);
    }
  }
  if (this->verbose == true) {
    std::operator<<((ostream *)&std::cerr,"|    done with passes for now\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  return;
}

Assistant:

void reduceUsingPasses() {
    // run optimization passes until we can't shrink it any more
    std::vector<std::string> passes = {
      "-Oz",
      "-Os",
      "-O1",
      "-O2",
      "-O3",
      "-O4",
      "--flatten -Os",
      "--flatten -O3",
      "--flatten --simplify-locals-notee-nostructure --local-cse -Os",
      "--coalesce-locals --vacuum",
      "--dae",
      "--dae-optimizing",
      "--dce",
      "--duplicate-function-elimination",
      "--gto",
      "--inlining",
      "--inlining-optimizing",
      "--optimize-level=3 --inlining-optimizing",
      "--local-cse",
      "--memory-packing",
      "--remove-unused-names --merge-blocks --vacuum",
      "--optimize-instructions",
      "--precompute",
      "--remove-imports",
      "--remove-memory",
      "--remove-unused-names --remove-unused-brs",
      "--remove-unused-module-elements",
      "--remove-unused-nonfunction-module-elements",
      "--reorder-functions",
      "--reorder-locals",
      // TODO: signature* passes
      "--simplify-globals",
      "--simplify-locals --vacuum",
      "--strip",
      "--vacuum"};
    auto oldSize = file_size(working);
    bool more = true;
    while (more) {
      // std::cerr << "|    starting passes loop iteration\n";
      more = false;
      // try both combining with a generic shrink (so minor pass overhead is
      // compensated for), and without
      for (auto pass : passes) {
        std::string currCommand = Path::getBinaryenBinaryTool("wasm-opt") + " ";
        currCommand += working + " -o " + test + " " + pass + " " + extraFlags;
        if (!binary) {
          currCommand += " -S ";
        }
        if (verbose) {
          std::cerr << "|    trying pass command: " << currCommand << "\n";
        }
        if (!ProgramResult(currCommand).failed()) {
          auto newSize = file_size(test);
          if (newSize < oldSize) {
            // the pass didn't fail, and the size looks smaller, so promising
            // see if it is still has the property we are preserving
            if (ProgramResult(command) == expected) {
              std::cerr << "|    command \"" << currCommand
                        << "\" succeeded, reduced size to " << newSize << '\n';
              copy_file(test, working);
              more = true;
              oldSize = newSize;
            }
          }
        }
      }
    }
    if (verbose) {
      std::cerr << "|    done with passes for now\n";
    }
  }